

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O2

char * flow::cstr(UnaryOperator op)

{
  return &DAT_001641f4 + *(int *)(&DAT_001641f4 + (long)(int)op * 4);
}

Assistant:

const char* cstr(UnaryOperator op)  // {{{
{
  switch (op) {
  case UnaryOperator::INeg: return "ineg";
  case UnaryOperator::INot: return "inot";
  case UnaryOperator::BNot: return "bnot";
  case UnaryOperator::SLen: return "slen";
  case UnaryOperator::SIsEmpty: return "sisempty";
  }
}